

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_short,unsigned_short(*&)(unsigned_short,unsigned_short)>
          (Memory *this,u64 offset,u64 addend,unsigned_short rhs,
          BinopFunc<unsigned_short,_unsigned_short> **func,unsigned_short *out)

{
  unsigned_short val;
  Result RVar1;
  Enum EVar2;
  unsigned_short lhs;
  unsigned_short *local_38;
  
  local_38 = out;
  RVar1 = AtomicLoad<unsigned_short>(this,offset,addend,&lhs);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    val = (**func)(lhs,rhs);
    RVar1 = AtomicStore<unsigned_short>(this,offset,addend,val);
    if (RVar1.enum_ != Error) {
      *local_38 = lhs;
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}